

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O3

void nn_msg_array_term(nn_list *msg_array)

{
  int iVar1;
  msg_chunk *it;
  
  while( true ) {
    iVar1 = nn_list_empty(msg_array);
    if (iVar1 != 0) break;
    it = (msg_chunk *)nn_list_begin(msg_array);
    nn_msg_chunk_term(it,msg_array);
  }
  nn_list_term(msg_array);
  return;
}

Assistant:

void nn_msg_array_term (struct nn_list *msg_array)
{
    struct nn_list_item *it;
    struct msg_chunk *ch;

    while (!nn_list_empty (msg_array)) {
        it = nn_list_begin (msg_array);
        ch = nn_cont (it, struct msg_chunk, item);
        nn_msg_chunk_term (ch, msg_array);
    }

    nn_list_term (msg_array);
}